

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_reschedule_plugin(_func_void *plugin,int cycle,int shift)

{
  int iVar1;
  char local_25;
  char flag;
  ulong uStack_20;
  int abs_cycle;
  size_t i;
  int shift_local;
  int cycle_local;
  _func_void *plugin_local;
  
  local_25 = '\0';
  iVar1 = cycle;
  if (cycle < 1) {
    iVar1 = -cycle;
  }
  i._0_4_ = shift;
  if (iVar1 == 0) {
    i._0_4_ = 0;
  }
  else {
    for (; iVar1 <= (int)i; i._0_4_ = (int)i - iVar1) {
    }
    for (; (int)i < 0; i._0_4_ = iVar1 + (int)i) {
    }
  }
  for (uStack_20 = 0; uStack_20 < (fsnav->core).plugin_count; uStack_20 = uStack_20 + 1) {
    if ((fsnav->core).plugins[uStack_20].func == plugin) {
      (fsnav->core).plugins[uStack_20].cycle = cycle;
      (fsnav->core).plugins[uStack_20].shift = (int)i;
      (fsnav->core).plugins[uStack_20].tick = 0;
      local_25 = '\x01';
    }
  }
  return local_25;
}

Assistant:

char fsnav_reschedule_plugin(void(*plugin)(void), int cycle, int shift)
{
	size_t i;
	int abs_cycle;
	char flag = 0;
	// shrink shift to [0..cycle-1]
	abs_cycle = abs(cycle);
	if (abs_cycle) {
		while (shift >= abs_cycle)
			shift -= abs_cycle;
		while (shift < 0)
			shift += abs_cycle;
	}
	else
		shift = 0;
	// go through execution list and set scheduling parameters, if found the plugin
	for (i = 0; i < fsnav->core.plugin_count; i++) {
		if (fsnav->core.plugins[i].func == plugin) {
			fsnav->core.plugins[i].cycle = cycle;
			fsnav->core.plugins[i].shift = shift;
			fsnav->core.plugins[i].tick  = 0;
			flag = 1;
		}
	}
	return flag;
}